

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

TableGet * __thiscall
wasm::Builder::makeTableGet(Builder *this,Name table,Expression *index,Type type)

{
  TableGet *pTVar1;
  
  pTVar1 = MixedArena::alloc<wasm::TableGet>((MixedArena *)(this->wasm + 0x200));
  (pTVar1->table).super_IString.str._M_len = table.super_IString.str._M_len;
  (pTVar1->table).super_IString.str._M_str = table.super_IString.str._M_str;
  pTVar1->index = index;
  (pTVar1->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id = type.id;
  wasm::TableGet::finalize();
  return pTVar1;
}

Assistant:

TableGet* makeTableGet(Name table, Expression* index, Type type) {
    auto* ret = wasm.allocator.alloc<TableGet>();
    ret->table = table;
    ret->index = index;
    ret->type = type;
    ret->finalize();
    return ret;
  }